

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
::operator()(BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
             *this,int it)

{
  reference psVar1;
  reference psVar2;
  int local_20;
  int local_1c;
  
  local_20 = it;
  psVar1 = marray_detail::AccessOperatorHelper<true>::
           execute<short,int,false,std::allocator<unsigned_long>>
                     (*(View<short,_false,_std::allocator<unsigned_long>_> **)this,&local_20);
  local_1c = it;
  psVar2 = marray_detail::AccessOperatorHelper<true>::
           execute<short,int,false,std::allocator<unsigned_long>>
                     (*(View<short,_false,_std::allocator<unsigned_long>_> **)(this + 8),&local_1c);
  return *psVar2 + *psVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }